

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::gjInverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  ulong uVar1;
  uint uVar2;
  float (*pafVar3) [4];
  SingMatrixExc *this_00;
  ulong uVar4;
  long lVar5;
  float (*pafVar6) [4];
  float (*pafVar7) [4];
  float (*pafVar8) [4];
  int iVar9;
  float (*pafVar10) [4];
  ulong uVar11;
  float (*pafVar12) [4];
  ulong uVar13;
  long lVar14;
  float (*pafVar15) [4];
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Matrix44<float> t;
  Matrix44<float> s;
  
  pafVar8 = (float (*) [4])&s;
  s.x[1][3] = 0.0;
  s.x[2][0] = 0.0;
  s.x[2][3] = 0.0;
  s.x[3][0] = 0.0;
  s.x[0][1] = 0.0;
  s.x[0][2] = 0.0;
  s.x[0][3] = 0.0;
  s.x[1][0] = 0.0;
  s.x[3][1] = 0.0;
  s.x[3][2] = 0.0;
  s.x[0][0] = 1.0;
  s.x[1][1] = 1.0;
  s.x[1][2] = 0.0;
  s.x[2][1] = 0.0;
  s.x[2][2] = 1.0;
  s.x[3][3] = 1.0;
  pafVar10 = (float (*) [4])&t;
  Matrix44((Matrix44<float> *)pafVar10,this);
  pafVar3 = t.x + 1;
  uVar4 = 1;
  lVar5 = 0x30;
  pafVar6 = s.x;
  pafVar7 = pafVar3;
  uVar13 = 0;
  while (pafVar6 = pafVar6 + 1, uVar13 != 3) {
    fVar18 = *(float *)((long)t.x + uVar13 * 0x14);
    fVar17 = -fVar18;
    if (-fVar18 <= fVar18) {
      fVar17 = fVar18;
    }
    uVar11 = uVar4 & 0xffffffff;
    uVar16 = uVar13 & 0xffffffff;
    for (lVar14 = 0; lVar5 != lVar14; lVar14 = lVar14 + 0x10) {
      fVar18 = *(float *)((long)*pafVar7 + lVar14);
      fVar19 = -fVar18;
      if (-fVar18 <= fVar18) {
        fVar19 = fVar18;
      }
      uVar1 = uVar11;
      if (fVar19 <= fVar17) {
        fVar19 = fVar17;
        uVar1 = uVar16;
      }
      uVar16 = uVar1;
      fVar17 = fVar19;
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    if ((fVar17 == 0.0) && (!NAN(fVar17))) goto LAB_001b1b97;
    iVar9 = (int)uVar16;
    if (uVar13 != uVar16) {
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        fVar18 = (*pafVar10)[lVar14];
        (*pafVar10)[lVar14] = t.x[iVar9][lVar14];
        t.x[iVar9][lVar14] = fVar18;
        fVar18 = (*pafVar8)[lVar14];
        (*pafVar8)[lVar14] = s.x[iVar9][lVar14];
        s.x[iVar9][lVar14] = fVar18;
      }
    }
    pafVar12 = pafVar3;
    pafVar15 = pafVar6;
    for (uVar16 = uVar4; uVar16 != 4; uVar16 = uVar16 + 1) {
      fVar18 = -t.x[uVar16][uVar13] / *(float *)((long)t.x + uVar13 * 0x14);
      for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
        *(float *)((long)*pafVar12 + lVar14) =
             *(float *)((long)*(float (*) [4])*pafVar10 + lVar14) * fVar18 +
             *(float *)((long)*pafVar12 + lVar14);
        *(float *)((long)*pafVar15 + lVar14) =
             *(float *)((long)*(float (*) [4])*pafVar8 + lVar14) * fVar18 +
             *(float *)((long)*pafVar15 + lVar14);
      }
      pafVar15 = pafVar15 + 1;
      pafVar12 = pafVar12 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + -0x10;
    pafVar7 = (float (*) [4])(pafVar7[1] + 1);
    pafVar8 = pafVar8 + 1;
    pafVar10 = pafVar10 + 1;
    pafVar3 = pafVar3 + 1;
    uVar13 = uVar13 + 1;
  }
  uVar2 = 3;
  while( true ) {
    if ((int)uVar2 < 0) {
      Matrix44(__return_storage_ptr__,&s);
      return __return_storage_ptr__;
    }
    uVar4 = (ulong)uVar2;
    fVar18 = *(float *)((long)t.x + uVar4 * 0x14);
    if ((fVar18 == 0.0) && (!NAN(fVar18))) break;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      t.x[uVar4][lVar5] = t.x[uVar4][lVar5] / fVar18;
      s.x[uVar4][lVar5] = s.x[uVar4][lVar5] / fVar18;
    }
    pafVar8 = (float (*) [4])&t;
    pafVar10 = (float (*) [4])&s;
    for (uVar13 = 0; uVar13 != uVar4; uVar13 = uVar13 + 1) {
      fVar18 = -t.x[uVar13][uVar4];
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        (*(float (*) [4])*pafVar8)[lVar5] =
             t.x[uVar4][lVar5] * fVar18 + (*(float (*) [4])*pafVar8)[lVar5];
        (*(float (*) [4])*pafVar10)[lVar5] =
             s.x[uVar4][lVar5] * fVar18 + (*(float (*) [4])*pafVar10)[lVar5];
      }
      pafVar10 = pafVar10 + 1;
      pafVar8 = pafVar8 + 1;
    }
    uVar2 = uVar2 - 1;
  }
LAB_001b1b97:
  if (!singExc) {
    *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
    *(undefined8 *)(__return_storage_ptr__->x[1] + 3) = 0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
    *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
    *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
    *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[3][3] = 1.0;
    return __return_storage_ptr__;
  }
  this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
  Imath_2_5::SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
  __cxa_throw(this_00,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
}

Assistant:

Matrix44<T>
Matrix44<T>::gjInverse (bool singExc) const
{
    int i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3 ; i++)
    {
        int pivot = i;

        T pivotsize = t[i][i];

        if (pivotsize < 0)
            pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t[j][i];

            if (tmp < 0)
                tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix44();
        }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp = t[i][j];
                t[i][j] = t[pivot][j];
                t[pivot][j] = tmp;

                tmp = s[i][j];
                s[i][j] = s[pivot][j];
                s[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t[j][i] / t[i][i];

            for (k = 0; k < 4; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix44();
        }

        for (j = 0; j < 4; j++)
        {
            t[i][j] /= f;
            s[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t[j][i];

            for (k = 0; k < 4; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    return s;
}